

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

void __thiscall PRM::Environment::Environment(Environment *this,int *_space_dimension)

{
  int iVar1;
  pointer pfVar2;
  float *l;
  pointer pfVar3;
  RandomPointGenerator *this_00;
  vctr *__range2;
  
  this->_vptr_Environment = (_func_int **)&PTR___cxa_pure_virtual_001312c0;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = *_space_dimension;
  this->space_dimension = iVar1;
  std::vector<float,_std::allocator<float>_>::resize(&this->dimensions,(long)iVar1);
  pfVar2 = (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar3 = (this->dimensions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar2; pfVar3 = pfVar3 + 1) {
    *pfVar3 = 10.0;
  }
  this_00 = (RandomPointGenerator *)operator_new(0x20);
  RandomPointGenerator::RandomPointGenerator(this_00,&this->space_dimension,&this->dimensions);
  this->random = this_00;
  return;
}

Assistant:

Environment(const int& _space_dimension)
        
        {
            space_dimension=_space_dimension;
            dimensions.resize(space_dimension);
            for (auto& l:dimensions){l = 10.0;}
            random = new RandomPointGenerator(space_dimension,dimensions);
            
            return;
        }